

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_helper.h
# Opt level: O0

uint tLeft(vector<unsigned_int,_std::allocator<unsigned_int>_> *t,int l)

{
  reference pvVar1;
  int local_1c;
  int local_18;
  int i;
  uint res;
  int l_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *t_local;
  
  if (-1 < l) {
    local_18 = 0;
    for (local_1c = 0; local_1c < l + -1; local_1c = local_1c + 1) {
      pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (t,(long)local_1c);
      local_18 = *pvVar1 + 1 + local_18;
    }
    return local_18 - 1;
  }
  __assert_fail("l >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sebawild[P]quickselect-integral-equation/integral_helper.h"
                ,0x62,"unsigned int tLeft(vector<unsigned int>, int)");
}

Assistant:

unsigned int tLeft(vector<unsigned int> t, int l) {
	assert(l >= 0);
	unsigned int res = 0;
	for (int i = 0; i < l-1; ++i) {
		res += t[i] + 1;
	}
	return res - 1;
}